

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_trcddi.cpp
# Opt level: O1

ze_result_t
tracing_layer::zeMemOpenIpcHandle
          (ze_context_handle_t hContext,ze_device_handle_t hDevice,ze_ipc_mem_handle_t handle,
          ze_ipc_memory_flags_t flags,void **pptr)

{
  _func_void__ze_mem_open_ipc_handle_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr *p_Var1;
  _ze_ipc_mem_handle_t _Var2;
  _func__ze_result_t__ze_context_handle_t_ptr__ze_device_handle_t_ptr__ze_ipc_mem_handle_t_uint_void_ptr_ptr
  *zeApiPtr;
  _ze_result_t _Var3;
  ze_result_t zVar4;
  char *pcVar5;
  ulong *puVar6;
  void **in_RCX;
  uint in_EDX;
  long lVar7;
  _ze_device_handle_t *in_RSI;
  _ze_context_handle_t *in_RDI;
  ulong uVar8;
  undefined1 uStack0000000000000008;
  undefined1 uStack0000000000000009;
  undefined1 uStack000000000000000a;
  undefined1 uStack000000000000000b;
  undefined1 uStack000000000000000c;
  undefined1 uStack000000000000000d;
  undefined1 uStack000000000000000e;
  undefined1 uStack000000000000000f;
  undefined1 uStack0000000000000010;
  undefined1 uStack0000000000000011;
  undefined1 uStack0000000000000012;
  undefined1 uStack0000000000000013;
  undefined1 uStack0000000000000014;
  undefined1 uStack0000000000000015;
  undefined1 uStack0000000000000016;
  undefined1 uStack0000000000000017;
  undefined1 uStack0000000000000018;
  undefined1 uStack0000000000000019;
  undefined1 uStack000000000000001a;
  undefined1 uStack000000000000001b;
  undefined1 uStack000000000000001c;
  undefined1 uStack000000000000001d;
  undefined1 uStack000000000000001e;
  undefined1 uStack000000000000001f;
  undefined1 uStack0000000000000020;
  undefined1 uStack0000000000000021;
  undefined1 uStack0000000000000022;
  undefined1 uStack0000000000000023;
  APITracerCallbackDataImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>
  apiCallbackData;
  APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>
  epilogCallback;
  APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>
  prologCallback;
  ze_mem_open_ipc_handle_params_t tracerParams;
  uint local_104;
  void **local_100;
  _ze_device_handle_t *local_f8;
  _ze_context_handle_t *local_f0;
  _func_void__ze_mem_open_ipc_handle_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr *local_e8;
  vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
  vStack_e0;
  vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
  local_c8;
  vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
  local_a8;
  vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
  local_90;
  APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>
  local_78;
  APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>
  local_68;
  _ze_mem_open_ipc_handle_params_t local_58;
  
  if (_DAT_0017f518 ==
      (_func__ze_result_t__ze_context_handle_t_ptr__ze_device_handle_t_ptr__ze_ipc_mem_handle_t_uint_void_ptr_ptr
       *)0x0) {
    zVar4 = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
  }
  else {
    local_104 = in_EDX;
    local_100 = in_RCX;
    local_f8 = in_RSI;
    local_f0 = in_RDI;
    tracing_layer::tracingInProgress::__tls_init();
    pcVar5 = (char *)__tls_get_addr(&PTR_0017efa0);
    if (*pcVar5 != '\0') {
      _Var2.data[0x1c] = (undefined1)flags;
      _Var2.data[0x1d] = flags._1_1_;
      _Var2.data[0x1e] = flags._2_1_;
      _Var2.data[0x1f] = flags._3_1_;
      _Var2.data[0] = uStack0000000000000008;
      _Var2.data[1] = uStack0000000000000009;
      _Var2.data[2] = uStack000000000000000a;
      _Var2.data[3] = uStack000000000000000b;
      _Var2.data[4] = uStack000000000000000c;
      _Var2.data[5] = uStack000000000000000d;
      _Var2.data[6] = uStack000000000000000e;
      _Var2.data[7] = uStack000000000000000f;
      _Var2.data[8] = uStack0000000000000010;
      _Var2.data[9] = uStack0000000000000011;
      _Var2.data[10] = uStack0000000000000012;
      _Var2.data[0xb] = uStack0000000000000013;
      _Var2.data[0xc] = uStack0000000000000014;
      _Var2.data[0xd] = uStack0000000000000015;
      _Var2.data[0xe] = uStack0000000000000016;
      _Var2.data[0xf] = uStack0000000000000017;
      _Var2.data[0x10] = uStack0000000000000018;
      _Var2.data[0x11] = uStack0000000000000019;
      _Var2.data[0x12] = uStack000000000000001a;
      _Var2.data[0x13] = uStack000000000000001b;
      _Var2.data[0x14] = uStack000000000000001c;
      _Var2.data[0x15] = uStack000000000000001d;
      _Var2.data[0x16] = uStack000000000000001e;
      _Var2.data[0x17] = uStack000000000000001f;
      _Var2.data[0x18] = uStack0000000000000020;
      _Var2.data[0x19] = uStack0000000000000021;
      _Var2.data[0x1a] = uStack0000000000000022;
      _Var2.data[0x1b] = uStack0000000000000023;
      _Var2.data._32_8_ = pptr;
      _Var2.data._40_8_ = hDevice;
      _Var2.data._48_8_ = hContext;
      _Var2.data._56_8_ = apiCallbackData.apiOrdinal;
      _Var3 = (*_DAT_0017f518)(local_f0,local_f8,_Var2,local_104,local_100);
      return _Var3;
    }
    tracing_layer::tracingInProgress::__tls_init();
    *pcVar5 = '\x01';
    local_58.phContext = &local_f0;
    local_58.phDevice = &local_f8;
    local_58.pflags = &local_104;
    local_58.ppptr = &local_100;
    local_c8.
    super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_c8.
    super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>
          *)0x0;
    vStack_e0.
    super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>
          *)0x0;
    vStack_e0.
    super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>
          *)0x0;
    local_e8 = (_func_void__ze_mem_open_ipc_handle_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr *
               )0x0;
    vStack_e0.
    super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_c8.
    super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>
          *)0x0;
    local_58.phandle = (_ze_ipc_mem_handle_t *)&stack0x00000008;
    puVar6 = (ulong *)(**(code **)(*pGlobalAPITracerContextImp + 0x10))();
    if ((puVar6 != (ulong *)0x0) && (*puVar6 != 0)) {
      lVar7 = 0;
      uVar8 = 0;
      do {
        local_68.current_api_callback =
             *(_func_void__ze_mem_open_ipc_handle_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr **
              )(puVar6[1] + 0x528 + lVar7);
        p_Var1 = *(_func_void__ze_mem_open_ipc_handle_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
                   **)(puVar6[1] + 0xb80 + lVar7);
        local_68.pUserData = *(void **)(puVar6[1] + 0xcb0 + lVar7);
        if (vStack_e0.
            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            vStack_e0.
            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_mem_open_ipc_handle_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_mem_open_ipc_handle_params_t*,_ze_result_t,void*,void**)>>>
          ::
          _M_realloc_insert<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_mem_open_ipc_handle_params_t*,_ze_result_t,void*,void**)>const&>
                    ((vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_mem_open_ipc_handle_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_mem_open_ipc_handle_params_t*,_ze_result_t,void*,void**)>>>
                      *)&vStack_e0,
                     (iterator)
                     vStack_e0.
                     super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,&local_68);
        }
        else {
          (vStack_e0.
           super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
           ._M_impl.super__Vector_impl_data._M_finish)->current_api_callback =
               local_68.current_api_callback;
          (vStack_e0.
           super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
           ._M_impl.super__Vector_impl_data._M_finish)->pUserData = local_68.pUserData;
          vStack_e0.
          super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               vStack_e0.
               super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
        local_78.pUserData = *(void **)(puVar6[1] + 0xcb0 + lVar7);
        local_78.current_api_callback = p_Var1;
        if (local_c8.
            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_c8.
            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_mem_open_ipc_handle_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_mem_open_ipc_handle_params_t*,_ze_result_t,void*,void**)>>>
          ::
          _M_realloc_insert<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_mem_open_ipc_handle_params_t*,_ze_result_t,void*,void**)>const&>
                    ((vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_mem_open_ipc_handle_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_mem_open_ipc_handle_params_t*,_ze_result_t,void*,void**)>>>
                      *)&local_c8,
                     (iterator)
                     local_c8.
                     super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,&local_78);
        }
        else {
          (local_c8.
           super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
           ._M_impl.super__Vector_impl_data._M_finish)->current_api_callback = p_Var1;
          (local_c8.
           super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
           ._M_impl.super__Vector_impl_data._M_finish)->pUserData = local_78.pUserData;
          local_c8.
          super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_c8.
               super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
        uVar8 = uVar8 + 1;
        lVar7 = lVar7 + 0xcb8;
      } while (uVar8 < *puVar6);
    }
    p_Var1 = local_e8;
    zeApiPtr = _DAT_0017f518;
    std::
    vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ::vector(&local_90,&vStack_e0);
    std::
    vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ::vector(&local_a8,&local_c8);
    zVar4 = APITracerWrapperImp<_ze_result_t(*)(_ze_context_handle_t*,_ze_device_handle_t*,_ze_ipc_mem_handle_t,unsigned_int,void**),_ze_mem_open_ipc_handle_params_t*,void(*)(_ze_mem_open_ipc_handle_params_t*,_ze_result_t,void*,void**),std::vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_mem_open_ipc_handle_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_mem_open_ipc_handle_params_t*,_ze_result_t,void*,void**)>>>,std::vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_mem_open_ipc_handle_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_mem_open_ipc_handle_params_t*,_ze_result_t,void*,void**)>>>,_ze_context_handle_t*&,_ze_device_handle_t*&,_ze_ipc_mem_handle_t&,unsigned_int&,void**&>
                      (zeApiPtr,&local_58,p_Var1,&local_90,&local_a8,local_58.phContext,
                       local_58.phDevice,local_58.phandle,local_58.pflags,local_58.ppptr);
    if (local_a8.
        super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a8.
                      super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_a8.
                            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_a8.
                            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_90.
        super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_90.
                      super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_90.
                            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_90.
                            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_c8.
        super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_c8.
                      super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_c8.
                            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_c8.
                            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (vStack_e0.
        super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(vStack_e0.
                      super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)vStack_e0.
                            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)vStack_e0.
                            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_open_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  return zVar4;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeMemOpenIpcHandle(
        ze_context_handle_t hContext,                   ///< [in] handle of the context object
        ze_device_handle_t hDevice,                     ///< [in] handle of the device to associate with the IPC memory handle
        ze_ipc_mem_handle_t handle,                     ///< [in] IPC memory handle
        ze_ipc_memory_flags_t flags,                    ///< [in] flags controlling the operation.
                                                        ///< must be 0 (default) or a valid combination of ::ze_ipc_memory_flag_t.
        void** pptr                                     ///< [out] pointer to device allocation in this process
        )
    {
        auto pfnOpenIpcHandle = context.zeDdiTable.Mem.pfnOpenIpcHandle;

        if( nullptr == pfnOpenIpcHandle)
            return ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;

        ZE_HANDLE_TRACER_RECURSION(context.zeDdiTable.Mem.pfnOpenIpcHandle, hContext, hDevice, handle, flags, pptr);

        // capture parameters
        ze_mem_open_ipc_handle_params_t tracerParams = {
            &hContext,
            &hDevice,
            &handle,
            &flags,
            &pptr
        };

        tracing_layer::APITracerCallbackDataImp<ze_pfnMemOpenIpcHandleCb_t> apiCallbackData;

        ZE_GEN_PER_API_CALLBACK_STATE(apiCallbackData, ze_pfnMemOpenIpcHandleCb_t, Mem, pfnOpenIpcHandleCb);


        return tracing_layer::APITracerWrapperImp(context.zeDdiTable.Mem.pfnOpenIpcHandle,
                                                  &tracerParams,
                                                  apiCallbackData.apiOrdinal,
                                                  apiCallbackData.prologCallbacks,
                                                  apiCallbackData.epilogCallbacks,
                                                  *tracerParams.phContext,
                                                  *tracerParams.phDevice,
                                                  *tracerParams.phandle,
                                                  *tracerParams.pflags,
                                                  *tracerParams.ppptr);
    }